

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool testing::internal::FindPairing(MatchMatrix *matrix,MatchResultListener *listener)

{
  bool bVar1;
  size_type sVar2;
  size_t sVar3;
  ostream *pairs;
  MatchResultListener *in_RSI;
  MatchMatrix *in_RDI;
  size_t mi;
  char *sep;
  bool result;
  size_t max_flow;
  ElementMatcherPairs matches;
  char (*in_stack_ffffffffffffff08) [89];
  MatchResultListener *in_stack_ffffffffffffff10;
  MatchResultListener *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  MatchMatrix *in_stack_ffffffffffffff68;
  ulong local_70;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_30;
  MatchResultListener *local_18;
  MatchMatrix *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  FindMaxBipartiteMatching(in_stack_ffffffffffffff68);
  sVar2 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::size(&local_30);
  sVar3 = MatchMatrix::RhsSize(local_10);
  if (sVar2 == sVar3) {
    sVar2 = std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::size(&local_30);
    if ((1 < sVar2) && (bVar1 = MatchResultListener::IsInterested(local_18), bVar1)) {
      for (local_70 = 0;
          sVar2 = std::
                  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::size(&local_30), local_70 < sVar2; local_70 = local_70 + 1) {
        MatchResultListener::operator<<
                  (in_stack_ffffffffffffff10,(char **)in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff20 =
             MatchResultListener::operator<<
                       (in_stack_ffffffffffffff10,(char (*) [13])in_stack_ffffffffffffff08);
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::operator[](&local_30,local_70);
        MatchResultListener::operator<<
                  (in_stack_ffffffffffffff10,(unsigned_long *)in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff10 =
             MatchResultListener::operator<<
                       (in_stack_ffffffffffffff10,(char (*) [25])in_stack_ffffffffffffff08);
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::operator[](&local_30,local_70);
        MatchResultListener::operator<<
                  (in_stack_ffffffffffffff10,(unsigned_long *)in_stack_ffffffffffffff08);
      }
    }
    local_1 = 1;
  }
  else {
    bVar1 = MatchResultListener::IsInterested(local_18);
    if (bVar1) {
      MatchResultListener::operator<<(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      MatchResultListener::operator<<
                (in_stack_ffffffffffffff10,(unsigned_long *)in_stack_ffffffffffffff08);
      MatchResultListener::operator<<
                (in_stack_ffffffffffffff10,(char (*) [5])in_stack_ffffffffffffff08);
      MatchMatrix::RhsSize(local_10);
      MatchResultListener::operator<<
                (in_stack_ffffffffffffff10,(unsigned_long *)in_stack_ffffffffffffff08);
      MatchResultListener::operator<<
                (in_stack_ffffffffffffff10,(char (*) [30])in_stack_ffffffffffffff08);
      pairs = MatchResultListener::stream(local_18);
      LogElementMatcherPairVec
                ((ElementMatcherPairs *)pairs,
                 (ostream *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    }
    local_1 = 0;
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)in_stack_ffffffffffffff20);
  return (bool)(local_1 & 1);
}

Assistant:

GTEST_API_ bool FindPairing(const MatchMatrix& matrix,
                            MatchResultListener* listener) {
  ElementMatcherPairs matches = FindMaxBipartiteMatching(matrix);

  size_t max_flow = matches.size();
  bool result = (max_flow == matrix.RhsSize());

  if (!result) {
    if (listener->IsInterested()) {
      *listener << "where no permutation of the elements can "
                   "satisfy all matchers, and the closest match is "
                << max_flow << " of " << matrix.RhsSize()
                << " matchers with the pairings:\n";
      LogElementMatcherPairVec(matches, listener->stream());
    }
    return false;
  }

  if (matches.size() > 1) {
    if (listener->IsInterested()) {
      const char *sep = "where:\n";
      for (size_t mi = 0; mi < matches.size(); ++mi) {
        *listener << sep << " - element #" << matches[mi].first
                  << " is matched by matcher #" << matches[mi].second;
        sep = ",\n";
      }
    }
  }
  return true;
}